

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall QListWidgetPrivate::setup(QListWidgetPrivate *this)

{
  undefined8 *puVar1;
  QAbstractItemView *this_00;
  void **ppvVar2;
  QAbstractItemModel *pQVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QAbstractListModel *this_01;
  undefined4 *puVar7;
  long lVar8;
  long in_FS_OFFSET;
  code *local_98;
  ImplFn local_90;
  code *local_88;
  undefined8 local_80;
  Connection local_78;
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  this_01 = (QAbstractListModel *)operator_new(0x40);
  QAbstractListModel::QAbstractListModel(this_01,(QObject *)this_00);
  *(undefined ***)this_01 = &PTR_metaObject_0081c248;
  *(undefined8 *)(this_01 + 0x10) = 0;
  *(undefined8 *)(this_01 + 0x18) = 0;
  *(undefined8 *)(this_01 + 0x20) = 0;
  *(undefined8 *)(this_01 + 0x28) = 0;
  *(undefined8 *)(this_01 + 0x30) = 0;
  *(undefined8 *)(this_01 + 0x38) = 0;
  QAbstractItemView::setModel(this_00,(QAbstractItemModel *)this_01);
  local_88 = QAbstractItemView::pressed;
  lVar8 = 0;
  local_80 = 0;
  local_98 = emitItemPressed;
  local_90 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QListWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemPressed;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_78,(void **)this_00,(QObject *)&local_88,ppvVar2,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  local_88 = QAbstractItemView::clicked;
  local_80 = 0;
  local_98 = emitItemClicked;
  local_90 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QListWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemClicked;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)this_00,(QObject *)&local_88,ppvVar2,(QSlotObjectBase *)&local_98,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  local_88 = QAbstractItemView::doubleClicked;
  local_80 = 0;
  local_98 = emitItemDoubleClicked;
  local_90 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QListWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemDoubleClicked;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)this_00,(QObject *)&local_88,ppvVar2,(QSlotObjectBase *)&local_98,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  local_88 = QAbstractItemView::activated;
  local_80 = 0;
  local_98 = emitItemActivated;
  local_90 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QListWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemActivated;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)this_00,(QObject *)&local_88,ppvVar2,(QSlotObjectBase *)&local_98,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  local_88 = QAbstractItemView::entered;
  local_80 = 0;
  local_98 = emitItemEntered;
  local_90 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QListWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemEntered;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)this_00,(QObject *)&local_88,ppvVar2,(QSlotObjectBase *)&local_98,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar3 = (this->super_QListViewPrivate).super_QAbstractItemViewPrivate.model;
  local_88 = QAbstractItemModel::dataChanged;
  local_80 = 0;
  local_98 = emitItemChanged;
  local_90 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QListWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemChanged;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar3,(QObject *)&local_88,ppvVar2,(QSlotObjectBase *)&local_98,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar3 = (this->super_QListViewPrivate).super_QAbstractItemViewPrivate.model;
  local_88 = QAbstractItemModel::dataChanged;
  local_80 = 0;
  local_98 = dataChanged;
  local_90 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QListWidgetPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = dataChanged;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar3,(QObject *)&local_88,ppvVar2,(QSlotObjectBase *)&local_98,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar3 = (this->super_QListViewPrivate).super_QAbstractItemViewPrivate.model;
  local_88 = QAbstractItemModel::columnsRemoved;
  local_80 = 0;
  local_98 = sort;
  local_90 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QListWidgetPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar7 + 4) = sort;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar3,(QObject *)&local_88,ppvVar2,(QSlotObjectBase *)&local_98,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  do {
    puVar1 = (undefined8 *)
             (&((array<QMetaObject::Connection,_8UL> *)(&this->selectionModelConnections + -4))->
               field_0x0 + lVar8 * 8);
    pvVar4 = (void *)*puVar1;
    uVar5 = puVar1[1];
    uVar6 = *(undefined8 *)(local_68 + lVar8 * 8 + -8);
    puVar1 = (undefined8 *)
             (&((array<QMetaObject::Connection,_8UL> *)(&this->selectionModelConnections + -4))->
               field_0x0 + lVar8 * 8);
    *puVar1 = (&local_78)[lVar8].d_ptr;
    puVar1[1] = uVar6;
    (&local_78)[lVar8].d_ptr = pvVar4;
    *(undefined8 *)(local_68 + lVar8 * 8 + -8) = uVar5;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 8);
  lVar8 = 0x38;
  do {
    QMetaObject::Connection::~Connection((Connection *)((long)&local_78.d_ptr + lVar8));
    lVar8 = lVar8 + -8;
  } while (lVar8 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetPrivate::setup()
{
    Q_Q(QListWidget);
    q->QListView::setModel(new QListModel(q));
    // view signals
    connections = {
        QObjectPrivate::connect(q, &QListWidget::pressed,
                                this, &QListWidgetPrivate::emitItemPressed),
        QObjectPrivate::connect(q, &QListWidget::clicked,
                                this, &QListWidgetPrivate::emitItemClicked),
        QObjectPrivate::connect(q, &QListWidget::doubleClicked,
                                this, &QListWidgetPrivate::emitItemDoubleClicked),
        QObjectPrivate::connect(q, &QListWidget::activated,
                                this, &QListWidgetPrivate::emitItemActivated),
        QObjectPrivate::connect(q, &QListWidget::entered,
                                this, &QListWidgetPrivate::emitItemEntered),
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QListWidgetPrivate::emitItemChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QListWidgetPrivate::dataChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::columnsRemoved,
                                this, &QListWidgetPrivate::sort)
    };
}